

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject = 0x839318;
  *(undefined8 *)&this->field_0x120 = 0x8393e0;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0x88 = 0x839340;
  (this->super_IfcActor).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x839368;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0xd0 = 0x839390;
  *(undefined8 *)&(this->super_IfcActor).field_0xf0 = 0x8393b8;
  puVar1 = *(undefined1 **)&(this->super_IfcActor).field_0x100;
  if (puVar1 != &this->field_0x110) {
    operator_delete(puVar1,*(long *)&this->field_0x110 + 1);
  }
  IfcActor::~IfcActor(&this->super_IfcActor,&PTR_construction_vtable_24__008393f8);
  operator_delete(this,0x138);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}